

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_ustar.c
# Opt level: O0

ssize_t archive_write_ustar_data(archive_write *a,void *buff,size_t s)

{
  ulong *puVar1;
  int iVar2;
  int ret;
  ustar *ustar;
  size_t s_local;
  void *buff_local;
  archive_write *a_local;
  
  puVar1 = (ulong *)a->format_data;
  ustar = (ustar *)s;
  if (*puVar1 < s) {
    ustar = (ustar *)*puVar1;
  }
  iVar2 = __archive_write_output(a,buff,(size_t)ustar);
  *puVar1 = *puVar1 - (long)ustar;
  if (iVar2 == 0) {
    a_local = (archive_write *)ustar;
  }
  else {
    a_local = (archive_write *)(long)iVar2;
  }
  return (ssize_t)a_local;
}

Assistant:

static ssize_t
archive_write_ustar_data(struct archive_write *a, const void *buff, size_t s)
{
	struct ustar *ustar;
	int ret;

	ustar = (struct ustar *)a->format_data;
	if (s > ustar->entry_bytes_remaining)
		s = (size_t)ustar->entry_bytes_remaining;
	ret = __archive_write_output(a, buff, s);
	ustar->entry_bytes_remaining -= s;
	if (ret != ARCHIVE_OK)
		return (ret);
	return (s);
}